

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

string * Imf_3_4::anon_unknown_23::prefixFromLayerName
                   (string *__return_storage_ptr__,string *layerName,Header *header)

{
  pointer pbVar1;
  size_t __n;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  StringVector *pSVar5;
  string *extraout_RAX;
  string *psVar6;
  size_t sVar7;
  
  if (layerName->_M_string_length == 0) goto LAB_001ad045;
  bVar3 = hasMultiView(header);
  if (bVar3) {
    pSVar5 = multiView_abi_cxx11_(header);
    pbVar1 = (pSVar5->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __n = pbVar1->_M_string_length;
    sVar7 = layerName->_M_string_length;
    if (__n == layerName->_M_string_length) {
      if (__n != 0) {
        iVar4 = bcmp((pbVar1->_M_dataplus)._M_p,(layerName->_M_dataplus)._M_p,__n);
        sVar7 = __n;
        if (iVar4 != 0) goto LAB_001ad067;
      }
LAB_001ad045:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return extraout_RAX;
    }
  }
  else {
    sVar7 = layerName->_M_string_length;
  }
LAB_001ad067:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (layerName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar7);
  psVar6 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar6;
}

Assistant:

string
prefixFromLayerName (const string& layerName, const Header& header)
{
    if (layerName.empty ()) return "";

    if (hasMultiView (header) && multiView (header)[0] == layerName) return "";

    return layerName + ".";
}